

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IColourImpl * Catch::anon_unknown_1::platformColourInstance(void)

{
  bool bVar1;
  int iVar2;
  IContext *pIVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  IColourImpl *local_60;
  int local_48;
  int local_30;
  YesOrNo colourMode;
  undefined1 local_20 [8];
  IConfigPtr config;
  ErrnoGuard guard;
  
  ErrnoGuard::ErrnoGuard
            ((ErrnoGuard *)
             ((long)&config.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  pIVar3 = getCurrentContext();
  iVar2 = (*pIVar3->_vptr_IContext[4])();
  clara::std::shared_ptr<const_Catch::IConfig>::shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)local_20,
             (shared_ptr<const_Catch::IConfig> *)CONCAT44(extraout_var,iVar2));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
  if (bVar1) {
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
    local_48 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x12])();
  }
  else {
    local_48 = 0;
  }
  local_30 = local_48;
  if (local_48 == 0) {
    bVar1 = useColourOnPlatform();
    local_30 = 2;
    if (bVar1) {
      local_30 = 1;
    }
  }
  if (local_30 == 1) {
    local_60 = PosixColourImpl::instance();
  }
  else {
    local_60 = NoColourImpl::instance();
  }
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)local_20);
  ErrnoGuard::~ErrnoGuard
            ((ErrnoGuard *)
             ((long)&config.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  return local_60;
}

Assistant:

IColourImpl* platformColourInstance() {
        ErrnoGuard guard;
        IConfigPtr config = getCurrentContext().getConfig();
        UseColour::YesOrNo colourMode = config
            ? config->useColour()
            : UseColour::Auto;
        if( colourMode == UseColour::Auto )
            colourMode = useColourOnPlatform()
                ? UseColour::Yes
                : UseColour::No;
        return colourMode == UseColour::Yes
            ? PosixColourImpl::instance()
            : NoColourImpl::instance();
    }